

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapInlinedStringDonated
          (Reflection *this,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  uint *puVar9;
  
  uVar5 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
  }
  uVar6 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
  }
  if (uVar5 != uVar6) {
    return;
  }
  this_00 = &this->schema_;
  uVar3 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
  if (uVar3 == 0) {
    SwapInlinedStringDonated();
LAB_001f955b:
    SwapInlinedStringDonated();
LAB_001f9565:
    SwapInlinedStringDonated();
LAB_001f956f:
    SwapInlinedStringDonated();
LAB_001f9579:
    SwapInlinedStringDonated();
LAB_001f9583:
    SwapInlinedStringDonated();
LAB_001f958d:
    SwapInlinedStringDonated();
  }
  else {
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_001f955b;
    uVar4 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    bVar1 = anon_unknown_6::IsIndexInHasBitSet
                      ((uint32_t *)
                       ((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),uVar3);
    uVar3 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
    if (uVar3 == 0) goto LAB_001f9565;
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_001f956f;
    uVar4 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    bVar2 = anon_unknown_6::IsIndexInHasBitSet
                      ((uint32_t *)
                       ((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),uVar3);
    if (bVar1 == bVar2) {
      return;
    }
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_001f9579;
    uVar3 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_001f9583;
    puVar9 = (uint *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    uVar3 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    if ((*puVar9 & 1) != 0) goto LAB_001f958d;
    puVar8 = (uint *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    if ((*puVar8 & 1) == 0) {
      uVar3 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
      if (uVar3 != 0) {
        uVar7 = 1 << ((byte)uVar3 & 0x1f);
        if (bVar2) {
          puVar9[uVar3 >> 5] = puVar9[uVar3 >> 5] | uVar7;
          puVar8[uVar3 >> 5] = puVar8[uVar3 >> 5] & ~uVar7;
          return;
        }
        puVar9[uVar3 >> 5] = puVar9[uVar3 >> 5] & ~uVar7;
        puVar8[uVar3 >> 5] = puVar8[uVar3 >> 5] | uVar7;
        return;
      }
      goto LAB_001f95a4;
    }
  }
  SwapInlinedStringDonated();
LAB_001f95a4:
  SwapInlinedStringDonated();
}

Assistant:

void Reflection::SwapInlinedStringDonated(Message* lhs, Message* rhs,
                                          const FieldDescriptor* field) const {
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  // If arenas differ, inined string fields are swapped by copying values.
  // Donation status should not be swapped.
  if (lhs_arena != rhs_arena) {
    return;
  }
  bool lhs_donated = IsInlinedStringDonated(*lhs, field);
  bool rhs_donated = IsInlinedStringDonated(*rhs, field);
  if (lhs_donated == rhs_donated) {
    return;
  }
  // If one is undonated, both must have already registered ArenaDtor.
  uint32_t* lhs_array = MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = MutableInlinedStringDonatedArray(rhs);
  ABSL_CHECK_EQ(lhs_array[0] & 0x1u, 0u);
  ABSL_CHECK_EQ(rhs_array[0] & 0x1u, 0u);
  // Swap donation status bit.
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  if (rhs_donated) {
    SetInlinedStringDonated(index, lhs_array);
    ClearInlinedStringDonated(index, rhs_array);
  } else {  // lhs_donated
    ClearInlinedStringDonated(index, lhs_array);
    SetInlinedStringDonated(index, rhs_array);
  }
}